

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  path *ppVar2;
  int iVar3;
  int extraout_EAX;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  ulong in_RCX;
  ulong uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  Twine *this;
  bool bVar10;
  StringRef path;
  StringRef path_00;
  StringRef name;
  StringRef name_00;
  StringRef SVar11;
  StringRef SVar12;
  StringRef productName;
  string command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pcVar6 = *argv;
  if (pcVar6 == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = strlen(pcVar6);
  }
  pcVar5 = (char *)0x0;
  SVar11.Length = sVar4;
  SVar11.Data = pcVar6;
  llvm::sys::PrintStackTraceOnErrorSignal(SVar11,false);
  ppVar2 = (path *)*argv;
  if (ppVar2 != (path *)0x0) {
    pcVar5 = (char *)strlen((char *)ppVar2);
  }
  path.Length = 2;
  path.Data = pcVar5;
  SVar11 = llvm::sys::path::filename(ppVar2,path,(Style)in_RCX);
  if ((SVar11.Length == 5) &&
     (uVar7 = *(uint *)SVar11.Data ^ 0x6a6e696e, in_RCX = (ulong)uVar7,
     (char)*(uint *)((long)SVar11.Data + 4) == 'a' && uVar7 == 0)) {
    name_00.Length = 5;
    name_00.Data = (char *)0x7;
    llbuild::commands::setProgramName((commands *)0x1cb676,name_00);
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    paVar1 = &local_a8.field_2;
    pbVar9 = &local_a8;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)pbVar9,"build","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,pbVar9
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_a8.field_2._M_allocated_capacity + 1);
      operator_delete(local_a8._M_dataplus._M_p,(ulong)pbVar9);
    }
    if (argc != 1) {
      uVar8 = 1;
      do {
        std::__cxx11::string::string((string *)&local_a8,argv[uVar8],(allocator *)&local_88);
        pbVar9 = &local_a8;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
                   &local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a8.field_2._M_allocated_capacity + 1);
          operator_delete(local_a8._M_dataplus._M_p,(ulong)pbVar9);
        }
        uVar8 = uVar8 + 1;
      } while ((uint)argc != uVar8);
    }
    iVar3 = llbuild::commands::executeNinjaCommand
                      ((commands *)&local_e8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pbVar9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_e8);
  }
  else {
    ppVar2 = (path *)*argv;
    if (ppVar2 == (path *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = (char *)strlen((char *)ppVar2);
    }
    path_00.Length = 2;
    path_00.Data = pcVar6;
    SVar12 = llvm::sys::path::filename(ppVar2,path_00,(Style)in_RCX);
    name.Length = (char *)SVar12.Length;
    name.Data = name.Length;
    llbuild::commands::setProgramName((commands *)SVar12.Data,name);
    bVar10 = true;
    if (argc != 1) {
      pbVar9 = &local_a8;
      std::__cxx11::string::string((string *)pbVar9,argv[1],&local_e9);
      pcVar6 = "--help";
      iVar3 = std::__cxx11::string::compare((char *)pbVar9);
      SVar12.Length = (size_t)pcVar6;
      SVar12.Data = (char *)pbVar9;
      bVar10 = iVar3 == 0;
    }
    if ((argc != 1) &&
       (SVar12.Length = SVar12.Length, SVar12.Data = local_a8._M_dataplus._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_a8._M_dataplus._M_p != &local_a8.field_2)) {
      uVar8 = local_a8.field_2._M_allocated_capacity + 1;
      operator_delete(local_a8._M_dataplus._M_p,uVar8);
      SVar12.Length = uVar8;
      SVar12.Data = local_a8._M_dataplus._M_p;
    }
    if (bVar10) {
      main_cold_2();
      this = (Twine *)SVar12.Data;
      this->LHSKind = StdStringKind;
      this->RHSKind = EmptyKind;
      this->LHS = (Child)SVar12.Length;
      bVar10 = llvm::Twine::isValid(this);
      if (!bVar10) {
        __assert_fail("isValid() && \"Invalid twine!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Twine.h"
                      ,0x119,"llvm::Twine::Twine(const std::string &)");
      }
      return extraout_EAX;
    }
    std::__cxx11::string::string((string *)&local_e8,argv[1],(allocator *)&local_88);
    iVar3 = std::__cxx11::string::compare((char *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 == 0) {
      productName.Length = in_RCX;
      productName.Data = (char *)0x7;
      llbuild::getLLBuildFullVersion_abi_cxx11_(&local_e8,(llbuild *)0x1cb676,productName);
      puts(local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      iVar3 = 0;
    }
    else {
      std::__cxx11::string::string((string *)&local_e8,argv[1],(allocator *)&local_88);
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (argc != 2) {
        uVar8 = 2;
        do {
          std::__cxx11::string::string((string *)&local_88,argv[uVar8],&local_ea);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
                     &local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          uVar8 = uVar8 + 1;
        } while ((uint)argc != uVar8);
      }
      args_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x1c4856;
      iVar3 = std::__cxx11::string::compare((char *)&local_e8);
      if (iVar3 == 0) {
        iVar3 = llbuild::commands::executeNinjaCommand((commands *)&local_c8,args_00);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_e8);
        if (iVar3 == 0) {
          iVar3 = llbuild::commands::executeBuildEngineCommand(&local_c8);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_e8);
          if (iVar3 == 0) {
            iVar3 = llbuild::commands::executeBuildSystemCommand(&local_c8);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_e8);
            if (iVar3 == 0) {
              local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_68,"llbuild-analyze","");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_48,&local_c8);
              iVar3 = executeExternalCommand(&local_68,&local_48);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_48);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              main_cold_1();
              iVar3 = 1;
            }
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return iVar3;
}

Assistant:

int main(int argc, const char **argv) {
  // Print stacks on error.
  llvm::sys::PrintStackTraceOnErrorSignal(argv[0]);
  
  // Support use of llbuild as a replacement for ninja by indirecting to the
  // `ninja build` subtool when invoked under the name `ninja.
  if (llvm::sys::path::filename(argv[0]) == "ninja") {
    // We still want to represent ourselves as llbuild in output messages.
    setProgramName("llbuild");

    std::vector<std::string> args;
    args.push_back("build");
    for (int i = 1; i != argc; ++i) {
      args.push_back(argv[i]);
    }
    return executeNinjaCommand(args);
  } else {
    setProgramName(llvm::sys::path::filename(argv[0]));
  }

  // Expect the first argument to be the name of a subtool to delegate to.
  if (argc == 1 || std::string(argv[1]) == "--help")
    usage();

  if (std::string(argv[1]) == "--version") {
    // Print the version and exit.
    printf("%s\n", getLLBuildFullVersion().c_str());
    return 0;
  }

  // Otherwise, expect a command name.
  std::string command(argv[1]);
  std::vector<std::string> args;
  for (int i = 2; i != argc; ++i) {
    args.push_back(argv[i]);
  }

  if (command == "ninja") {
    return executeNinjaCommand(args);
  } else if (command == "buildengine") {
    return executeBuildEngineCommand(args);
  } else if (command == "buildsystem") {
    return executeBuildSystemCommand(args);
  } else if (command == "analyze") {
    // Next to the llbuild binary we build a llbuild-analyze binary with SwiftPM
    // which we treat as a subtool to llbuild. If that doesn't exist, the exec
    // will fail.
    return executeExternalCommand("llbuild-analyze", args);
  } else {
    fprintf(stderr, "error: %s: unknown command '%s'\n", getProgramName(),
            command.c_str());
    return 1;
  }
}